

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

string * tinyusdz::tydra::DumpRenderScene
                   (string *__return_storage_ptr__,RenderScene *scene,string *format)

{
  pointer pRVar1;
  int iVar2;
  pointer pNVar3;
  pointer pUVar4;
  pointer pTVar5;
  pointer pBVar6;
  string *psVar7;
  WrapMode *pWVar8;
  bool bVar9;
  ostream *poVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  undefined8 uVar12;
  pointer pRVar13;
  uint32_t n;
  uint32_t n_73;
  uint32_t n_74;
  uint32_t n_75;
  WrapMode mode;
  uint32_t n_76;
  WrapMode mode_00;
  uint32_t n_77;
  uint32_t n_78;
  uint32_t n_79;
  uint32_t n_80;
  uint32_t n_81;
  uint32_t n_82;
  uint32_t n_83;
  uint32_t n_84;
  uint32_t n_85;
  uint32_t n_86;
  uint32_t n_87;
  uint32_t n_88;
  uint32_t n_89;
  uint32_t n_90;
  ColorSpace cty;
  uint32_t n_91;
  uint32_t n_92;
  uint32_t n_93;
  uint32_t n_94;
  ComponentType cty_00;
  uint32_t n_95;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t n_06;
  uint32_t n_07;
  uint32_t n_08;
  uint32_t n_09;
  uint32_t n_10;
  uint32_t n_11;
  uint32_t n_12;
  uint32_t uVar14;
  uint32_t n_13;
  uint32_t n_14;
  uint32_t extraout_EDX;
  uint32_t n_15;
  uint32_t extraout_EDX_00;
  uint32_t n_16;
  uint32_t n_17;
  uint32_t n_18;
  uint32_t n_19;
  uint32_t n_20;
  uint32_t n_21;
  uint32_t extraout_EDX_01;
  uint32_t n_22;
  uint32_t n_23;
  uint32_t n_24;
  uint32_t n_25;
  uint32_t n_26;
  uint32_t n_27;
  uint32_t n_28;
  VertexAttribute *vattr;
  undefined8 extraout_RDX;
  VertexAttribute *vattr_00;
  undefined8 extraout_RDX_00;
  VertexAttribute *vattr_01;
  VertexAttribute *vattr_02;
  matrix4d *v;
  undefined8 extraout_RDX_01;
  uint32_t extraout_EDX_02;
  uint32_t n_29;
  uint32_t n_30;
  uint32_t n_31;
  undefined8 extraout_RDX_02;
  uint32_t n_32;
  uint32_t n_33;
  uint32_t n_34;
  uint32_t n_35;
  uint32_t n_36;
  uint32_t n_37;
  uint32_t n_38;
  uint32_t n_39;
  uint32_t n_40;
  uint32_t n_41;
  uint32_t n_42;
  undefined8 extraout_RDX_03;
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  *samples;
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  *samples_00;
  uint32_t n_43;
  uint32_t n_44;
  uint32_t n_45;
  uint32_t n_46;
  uint32_t n_47;
  uint32_t n_48;
  uint32_t n_49;
  uint32_t n_50;
  uint32_t n_51;
  uint32_t n_52;
  uint32_t n_53;
  uint32_t n_54;
  uint32_t n_55;
  uint32_t n_56;
  uint32_t n_57;
  uint32_t n_58;
  uint32_t n_59;
  uint32_t n_60;
  uint32_t n_61;
  uint32_t n_62;
  uint32_t n_63;
  uint32_t n_64;
  uint32_t n_65;
  uint32_t n_66;
  uint32_t n_67;
  uint32_t n_68;
  uint32_t n_69;
  uint32_t n_70;
  uint32_t n_71;
  Channel channel;
  uint32_t n_72;
  undefined8 extraout_RDX_04;
  VertexAttribute *this;
  string *psVar15;
  _Rb_tree_node_base *p_Var16;
  pointer pAVar17;
  size_t i;
  ulong uVar18;
  RenderScene *pRVar19;
  long *plVar20;
  long lVar21;
  RenderMesh *pRVar22;
  value *this_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  allocator local_571;
  pointer local_570;
  pointer local_568;
  pointer local_560;
  string local_558;
  RenderScene *local_538;
  ostream *local_530;
  pointer local_528;
  string *local_520;
  string local_518;
  string local_4f8;
  long local_4d8;
  string *local_4d0;
  stringstream ss_3;
  ostream local_4b8 [376];
  stringstream ss_1;
  ostream local_330 [376];
  stringstream ss;
  ostream local_1a8 [376];
  
  local_538 = scene;
  local_4d0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  bVar9 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            format,"json");
  if (bVar9) {
    ::std::operator<<(local_1a8,"// `json` format is not supported yet. Use KDL format\n");
  }
  poVar10 = ::std::operator<<(local_1a8,"title ");
  ::std::__cxx11::string::string((string *)&ss_3,"\"",(allocator *)&local_4f8);
  quote((string *)&ss_1,&local_538->usd_filename,(string *)&ss_3);
  poVar10 = ::std::operator<<(poVar10,(string *)&ss_1);
  ::std::operator<<(poVar10,"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  poVar10 = ::std::operator<<(local_1a8,"default_root_node ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of Root Nodes : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of Meshes : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of Skeletons : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of Animations : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of Cameras : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of Materials : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of UVTextures : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of TextureImages : ");
  uVar12 = 0x50;
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  poVar10 = ::std::operator<<(local_1a8,"// # of Buffers : ");
  poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  ::std::operator<<(poVar10,"\n");
  ::std::operator<<(local_1a8,"\n");
  ::std::operator<<(local_1a8,"nodes {\n");
  lVar21 = 0;
  for (uVar18 = 0;
      pNVar3 = (local_538->nodes).
               super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar18 < (ulong)(((long)(local_538->nodes).
                              super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3) / 0x1a8);
      uVar18 = uVar18 + 1) {
    (anonymous_namespace)::DumpNode_abi_cxx11_
              ((string *)&ss_1,
               (_anonymous_namespace_ *)
               ((long)&(((Node *)(&pNVar3->local_matrix + -1))->prim_name)._M_dataplus + lVar21),
               (Node *)0x1,(uint32_t)uVar12);
    ::std::operator<<(local_1a8,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    lVar21 = lVar21 + 0x1a8;
  }
  ::std::operator<<(local_1a8,"}\n");
  ::std::operator<<(local_1a8,"meshes {\n");
  pRVar13 = (pointer)0x0;
  local_4d8 = 0x10;
  while( true ) {
    pRVar19 = local_538;
    if ((pointer)(((long)(local_538->meshes).
                         super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_538->meshes).
                        super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x520) <= pRVar13) break;
    poVar10 = ::std::operator<<(local_1a8,"[");
    poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    local_520 = (string *)::std::operator<<(poVar10,"] ");
    local_560 = (pRVar19->meshes).
                super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_568 = (pointer)((long)pRVar13 * 0x520);
    pRVar1 = local_560 + (long)pRVar13;
    local_570 = pRVar1;
    local_528 = pRVar13;
    ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    ::std::operator<<(poVar10,"mesh {\n");
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_00);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"prim_name ");
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,&pRVar1->prim_name,&local_558);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_01);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    local_530 = ::std::operator<<(poVar10,"abs_path ");
    pRVar13 = local_560;
    pAVar17 = local_568;
    psVar15 = &local_560->prim_name;
    psVar7 = &local_568->abs_path;
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,
          (string *)((long)&(psVar15->_M_dataplus)._M_p + (long)&(psVar7->_M_dataplus)._M_p),
          &local_558);
    poVar10 = ::std::operator<<(local_530,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_02);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    local_530 = ::std::operator<<(poVar10,"display_name ");
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,
          (string *)
          ((long)&(pRVar13->prim_name)._M_dataplus._M_p +
          (long)&(pAVar17->display_name)._M_dataplus._M_p),&local_558);
    poVar10 = ::std::operator<<(local_530,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_03);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"num_points ");
    psVar15 = &pAVar17->prim_name;
    this_00 = (value *)((long)&(pRVar13->points).
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl + (long)&(psVar15->_M_dataplus)._M_p);
    pRVar22 = (RenderMesh *)0xc;
    local_530 = (ostream *)this_00;
    ::std::__cxx11::to_string
              (&local_4f8,
               (*(long *)((long)&(((set<tinyusdz::tydra::UVTexture::Channel,_std::less<tinyusdz::tydra::UVTexture::Channel>,_std::allocator<tinyusdz::tydra::UVTexture::Channel>_>
                                    *)((long)&(pRVar13->points).
                                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                              ._M_impl + 8))->_M_t)._M_impl +
                         (long)&(psVar15->_M_dataplus)._M_p) - *(long *)this_00) / 0xc);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_04);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"points \"");
    tinyusdz::value::print_array_snipped<std::array<float,3ul>>
              (&local_4f8,this_00,
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
               (size_t)pRVar22);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_05);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"num_faceVertexCounts ");
    pRVar13 = local_570;
    pvVar11 = RenderMesh::faceVertexCounts(local_570);
    ::std::__cxx11::to_string
              (&local_4f8,
               (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_06);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"faceVertexCounts \"");
    pvVar11 = RenderMesh::faceVertexCounts(pRVar13);
    tinyusdz::value::print_array_snipped<unsigned_int>(&local_4f8,pvVar11,0x10);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_07);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"num_faceVertexIndices ");
    pvVar11 = RenderMesh::faceVertexIndices(pRVar13);
    ::std::__cxx11::to_string
              (&local_4f8,
               (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_08);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"faceVertexIndices \"");
    pvVar11 = RenderMesh::faceVertexIndices(pRVar13);
    tinyusdz::value::print_array_snipped<unsigned_int>(&local_4f8,pvVar11,0x10);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_09);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"materialId ");
    ::std::__cxx11::to_string(&local_4f8,*(int *)(local_530 + 0x478));
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_10);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"normals {\n");
    pRVar13 = local_560;
    pAVar17 = local_568;
    local_530 = (ostream *)((long)&local_568[1].display_name.field_2 + (long)&local_560->prim_name);
    (anonymous_namespace)::DumpVertexAttribute_abi_cxx11_
              (&local_4f8,(_anonymous_namespace_ *)local_530,vattr,(uint32_t)pRVar22);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_11);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    ::std::operator<<(poVar10,"}\n");
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_12);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"num_texcoordSlots ");
    ::std::__cxx11::to_string(&local_4f8,*(unsigned_long *)(local_530 + 0x88));
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    plVar20 = (long *)((long)&(pRVar13->texcoords)._M_h._M_before_begin._M_nxt +
                      (long)&pAVar17->prim_name);
    uVar12 = extraout_RDX;
    while( true ) {
      plVar20 = (long *)*plVar20;
      uVar14 = (uint32_t)uVar12;
      if (plVar20 == (long *)0x0) break;
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,uVar14);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      poVar10 = ::std::operator<<(poVar10,"texcoords_");
      ::std::__cxx11::to_string(&local_4f8,*(uint *)(plVar20 + 1));
      poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
      poVar10 = ::std::operator<<(poVar10," {\n");
      (anonymous_namespace)::DumpVertexAttribute_abi_cxx11_
                (&local_558,(_anonymous_namespace_ *)(plVar20 + 2),vattr_00,(uint32_t)pRVar22);
      poVar10 = ::std::operator<<(poVar10,(string *)&local_558);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_13);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"}\n");
      ::std::__cxx11::string::_M_dispose();
      uVar12 = extraout_RDX_00;
    }
    if ((local_570->binormals).data.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_570->binormals).data.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      this = &local_570->binormals;
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,uVar14);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      poVar10 = ::std::operator<<(poVar10,"binormals {\n");
      (anonymous_namespace)::DumpVertexAttribute_abi_cxx11_
                (&local_4f8,(_anonymous_namespace_ *)this,vattr_01,(uint32_t)pRVar22);
      poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_14);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"}\n");
      ::std::__cxx11::string::_M_dispose();
      uVar14 = extraout_EDX;
    }
    pRVar13 = local_570;
    if ((local_570->tangents).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_570->tangents).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_568 = (pointer)&local_570->tangents;
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,uVar14);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      poVar10 = ::std::operator<<(poVar10,"tangents {\n");
      (anonymous_namespace)::DumpVertexAttribute_abi_cxx11_
                (&local_4f8,(_anonymous_namespace_ *)local_568,vattr_02,(uint32_t)pRVar22);
      poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_15);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"}\n");
      ::std::__cxx11::string::_M_dispose();
      uVar14 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,uVar14);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"skel_id ");
    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,pRVar13->skel_id);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    uVar14 = n_16;
    if ((pRVar13->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (pRVar13->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_568 = (pointer)&(pRVar13->joint_and_weights).jointIndices;
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_16);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"skin {\n");
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_17);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      poVar10 = ::std::operator<<(poVar10,"geomBindTransform ");
      tinyusdz::to_string_abi_cxx11_(&local_558,(tinyusdz *)&pRVar13->joint_and_weights,v);
      ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
      quote(&local_4f8,&local_558,&local_518);
      poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_18);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      poVar10 = ::std::operator<<(poVar10,"elementSize ");
      pRVar22 = local_570;
      poVar10 = (ostream *)
                ::std::ostream::operator<<(poVar10,(local_570->joint_and_weights).elementSize);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_19);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      poVar10 = ::std::operator<<(poVar10,"jointIndices ");
      tinyusdz::value::print_array_snipped<int>
                (&local_558,(vector<int,_std::allocator<int>_> *)local_568,0x10);
      ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
      quote(&local_4f8,&local_558,&local_518);
      poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_20);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      poVar10 = ::std::operator<<(poVar10,"jointWeights ");
      tinyusdz::value::print_array_snipped<float>
                (&local_558,&(local_570->joint_and_weights).jointWeights,0x10);
      ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
      quote(&local_4f8,&local_558,&local_518);
      poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
      ::std::operator<<(poVar10,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_21);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"}\n");
      ::std::__cxx11::string::_M_dispose();
      pRVar13 = local_570;
      uVar14 = extraout_EDX_01;
    }
    if ((pRVar13->targets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,uVar14);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"shapeTargets {\n");
      ::std::__cxx11::string::_M_dispose();
      auVar23._8_8_ = extraout_RDX_01;
      auVar23._0_8_ = (pRVar13->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_568 = (pointer)&(pRVar13->targets)._M_t._M_impl.super__Rb_tree_header;
      while( true ) {
        pAVar17 = auVar23._0_8_;
        if (pAVar17 == local_568) break;
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,auVar23._8_4_);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,(string *)&pAVar17->abs_path);
        ::std::operator<<(poVar10," {\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_22);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"prim_name ");
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,&pAVar17->display_name,&local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_23);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"abs_path ");
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,(string *)&pAVar17->channels_map,&local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_24);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"display_name ");
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,(string *)((long)&(pAVar17->channels_map)._M_t._M_impl + 0x20),&local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_25);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"pointIndices ");
        tinyusdz::value::print_array_snipped<unsigned_int>
                  (&local_558,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&(pAVar17->blendshape_weights_map)._M_t._M_impl + 0x10),0x10);
        ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
        quote(&local_4f8,&local_558,&local_518);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_26);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"pointOffsets ");
        tinyusdz::value::print_array_snipped<std::array<float,3ul>>
                  (&local_558,
                   (value *)((long)&(pAVar17->blendshape_weights_map)._M_t._M_impl + 0x28),
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
                   (size_t)pRVar22);
        ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
        quote(&local_4f8,&local_558,&local_518);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_27);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"normalOffsets ");
        tinyusdz::value::print_array_snipped<std::array<float,3ul>>
                  (&local_558,(value *)pAVar17[1].prim_name.field_2._M_local_buf,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x10,
                   (size_t)pRVar22);
        ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
        quote(&local_4f8,&local_558,&local_518);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_28);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        auVar23 = ::std::_Rb_tree_increment((_Rb_tree_node_base *)pAVar17);
      }
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,auVar23._8_4_);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"}\n");
      ::std::__cxx11::string::_M_dispose();
      pRVar13 = local_570;
      uVar14 = extraout_EDX_02;
    }
    if ((pRVar13->material_subsetMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,uVar14);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"material_subsets {\n");
      ::std::__cxx11::string::_M_dispose();
      auVar24._8_8_ = extraout_RDX_02;
      auVar24._0_8_ =
           (local_570->material_subsetMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_570 = (pointer)&(local_570->material_subsetMap)._M_t._M_impl.super__Rb_tree_header;
      while( true ) {
        pRVar22 = auVar24._0_8_;
        if (pRVar22 == local_570) break;
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,auVar24._8_4_);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"material_subset {\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_29);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"material_id ");
        poVar10 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar10,*(int *)&(pRVar22->usdFaceVertexCounts).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x4,n_30);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"indices ");
        pvVar11 = &pRVar22->triangulatedFaceVertexCounts;
        if ((pRVar22->triangulatedFaceVertexCounts).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (pRVar22->triangulatedFaceVertexCounts).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pvVar11 = &pRVar22->triangulatedFaceVertexIndices;
        }
        tinyusdz::value::print_array_snipped<int>
                  (&local_558,(vector<int,_std::allocator<int>_> *)pvVar11,0x10);
        ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
        quote(&local_4f8,&local_558,&local_518);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_31);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        auVar24 = ::std::_Rb_tree_increment((_Rb_tree_node_base *)pRVar22);
      }
      pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,auVar24._8_4_);
      poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
      ::std::operator<<(poVar10,"}\n");
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_330,"\n");
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_32);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    ::std::operator<<(poVar10,"}\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
    ::std::operator<<((ostream *)local_520,(string *)&ss_3);
    ::std::__cxx11::string::_M_dispose();
    pRVar13 = (pointer)((long)&(local_528->prim_name)._M_dataplus._M_p + 1);
  }
  ::std::operator<<(local_1a8,"}\n");
  ::std::operator<<(local_1a8,"skeletons {\n");
  pRVar22 = (RenderMesh *)0x0;
  for (pAVar17 = (pointer)0x0;
      pAVar17 < (pointer)(((long)(pRVar19->skeletons).
                                 super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pRVar19->skeletons).
                                super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x1c8);
      pAVar17 = (pointer)((long)&(pAVar17->prim_name)._M_dataplus._M_p + 1)) {
    poVar10 = ::std::operator<<(local_1a8,"[");
    poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    local_560 = (pointer)::std::operator<<(poVar10,"] ");
    pRVar13 = (pointer)(pRVar19->skeletons).
                       super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    local_568 = pAVar17;
    local_528 = pRVar13;
    ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_33);
    local_570 = pRVar22;
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    ::std::operator<<(poVar10,"skeleton {\n");
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_34);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"name ");
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,
          (string *)((long)&(pRVar22->prim_name)._M_dataplus._M_p + (long)&pRVar13->prim_name),
          &local_558);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_35);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"abs_path ");
    pRVar1 = local_570;
    psVar15 = &local_570->abs_path;
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,(string *)((long)&(psVar15->_M_dataplus)._M_p + (long)&pRVar13->prim_name),
          &local_558);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_36);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"anim_id ");
    poVar10 = (ostream *)
              ::std::ostream::operator<<
                        (poVar10,*(int *)(&(pRVar1->texcoordSlotIdMap)._i_to_s._M_t._M_impl.
                                           field_0x0 + (long)&(pRVar13->prim_name)._M_string_length)
                        );
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_37);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    poVar10 = ::std::operator<<(poVar10,"display_name ");
    pRVar1 = local_528;
    psVar15 = &local_528->prim_name;
    psVar7 = &local_570->display_name;
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,(string *)((long)&(psVar7->_M_dataplus)._M_p + (long)psVar15),&local_558);
    pRVar19 = local_538;
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    pRVar13 = local_570;
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pAVar17 = local_568;
    anon_unknown_0::detail::DumpSkelNode
              (&ss_1,(SkelNode *)(&pRVar13->is_single_indexable + (long)&pRVar1->prim_name),2);
    ::std::operator<<(local_330,"\n");
    pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_38);
    poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
    ::std::operator<<(poVar10,"}\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
    ::std::operator<<((ostream *)local_560,(string *)&ss_3);
    ::std::__cxx11::string::_M_dispose();
    pRVar22 = (RenderMesh *)
              &(pRVar13->texcoordSlotIdMap)._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
  }
  ::std::operator<<(local_1a8,"}\n");
  ::std::operator<<(local_1a8,"animations {\n");
  psVar15 = (string *)0x0;
  do {
    pRVar19 = local_538;
    if ((string *)
        (((long)(local_538->animations).
                super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(local_538->animations).
               super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0xc0) <= psVar15) {
      ::std::operator<<(local_1a8,"}\n");
      ::std::operator<<(local_1a8,"cameras {\n");
      pRVar22 = (RenderMesh *)0x0;
      for (pAVar17 = (pointer)0x0;
          pAVar17 < (pointer)(((long)(pRVar19->cameras).
                                     super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pRVar19->cameras).
                                    super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x98);
          pAVar17 = (pointer)((long)&(pAVar17->prim_name)._M_dataplus._M_p + 1)) {
        poVar10 = ::std::operator<<(local_1a8,"[");
        poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        local_560 = (pointer)::std::operator<<(poVar10,"] ");
        local_528 = (pointer)(pRVar19->cameras).
                             super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                             ._M_impl.super__Vector_impl_data._M_start;
        psVar15 = &local_528->prim_name;
        local_570 = pRVar22;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_44);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"camera {\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_45);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"name ");
        local_568 = pAVar17;
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,(string *)((long)&(pRVar22->prim_name)._M_dataplus._M_p + (long)psVar15),
              &local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_46);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"abs_path ");
        pRVar1 = local_528;
        psVar15 = &local_528->prim_name;
        psVar7 = &local_570->abs_path;
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,(string *)((long)&(psVar7->_M_dataplus)._M_p + (long)psVar15),&local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_47);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"display_name ");
        pRVar13 = local_570;
        psVar15 = &pRVar1->prim_name;
        psVar7 = &local_570->display_name;
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,(string *)((long)&(psVar7->_M_dataplus)._M_p + (long)psVar15),&local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_48);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"shutterOpen ");
        ::std::__cxx11::to_string
                  (&local_4f8,
                   *(double *)
                    ((long)&(pRVar13->usdFaceVertexIndices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + (long)&psVar15->_M_string_length));
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_49);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"shutterClose ");
        pRVar1 = local_570;
        ::std::__cxx11::to_string
                  (&local_4f8,
                   *(double *)
                    ((long)&(pRVar13->usdFaceVertexIndices).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + (long)&psVar15->field_2));
        pAVar17 = local_568;
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pRVar19 = local_538;
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_50);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
        ::std::operator<<((ostream *)local_560,(string *)&ss_3);
        ::std::__cxx11::string::_M_dispose();
        pRVar22 = (RenderMesh *)&pRVar1->usdFaceVertexCounts;
      }
      ::std::operator<<(local_1a8,"}\n");
      ::std::operator<<(local_1a8,"\n");
      ::std::operator<<(local_1a8,"materials {\n");
      pRVar22 = (RenderMesh *)0xcc;
      pAVar17 = (pointer)0x0;
      while( true ) {
        pRVar19 = local_538;
        if ((pointer)((long)(local_538->materials).
                            super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_538->materials).
                            super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 8) <= pAVar17) break;
        poVar10 = ::std::operator<<(local_1a8,"[");
        local_568 = pAVar17;
        poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        local_560 = (pointer)::std::operator<<(poVar10,"] ");
        local_528 = (pointer)(pRVar19->materials).
                             super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                             ._M_impl.super__Vector_impl_data._M_start;
        pWVar8 = (WrapMode *)&local_528->field_0x64;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_3);
        pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x1,n_51);
        poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
        ::std::operator<<(poVar10,"material {\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,n_52);
        poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
        poVar10 = ::std::operator<<(poVar10,"name ");
        local_570 = pRVar22;
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,
              (string *)((long)pRVar22[-1].joint_and_weights.geomBindTransform.m + (long)pWVar8),
              &local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,n_53);
        poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
        poVar10 = ::std::operator<<(poVar10,"abs_path ");
        pRVar1 = local_528;
        psVar15 = (string *)&local_528->usdFaceVertexIndices;
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        quote(&local_4f8,
              (string *)
              ((undefined1 *)((long)pRVar22[-1].joint_and_weights.geomBindTransform.m + 4) +
              (long)&(psVar15->_M_dataplus)._M_p),&local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,n_54);
        poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
        poVar10 = ::std::operator<<(poVar10,"display_name ");
        pRVar13 = local_570;
        psVar15 = (string *)
                  ((long)local_570[-1].joint_and_weights.geomBindTransform.m +
                  (long)(((vec4 *)(&pRVar1->prim_name + 5))->_M_elems + 1));
        ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
        local_520 = psVar15;
        quote(&local_4f8,psVar15,&local_558);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,n_55);
        poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
        ::std::operator<<(poVar10,"surfaceShader = ");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
        ::std::operator<<(local_330,"PreviewSurfaceShader {\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_56);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        poVar10 = ::std::operator<<(poVar10,"useSpecularWorkflow = ");
        ::std::__cxx11::to_string
                  (&local_558,
                   (uint)(byte)((undefined1 *)((long)&pRVar13[-1].targets._M_t._M_impl + 4))
                               [(long)&(pRVar1->prim_name)._M_dataplus._M_p]);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_558);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_57);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"diffuseColor = ");
        ::std::__cxx11::string::_M_dispose();
        pRVar13 = local_570;
        if (*(int *)&local_520[1].field_2 < 0) {
          ::std::operator<<(local_330,
                            (float3 *)
                            ((long)&(((_Rb_tree_header *)
                                     ((long)&local_570[-1].targets._M_t._M_impl + 8))->_M_header).
                                    _M_color + (long)&(pRVar1->prim_name)._M_dataplus));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          pRVar13 = local_570;
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&pRVar1[-1].targets._M_t._M_impl + 0x14) +
                                               (long)local_570));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_58);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"metallic = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((undefined1 *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 4) +
                    (long)pRVar13) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                               (long)&(pRVar13->prim_name)._M_dataplus));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                                                4) + (long)pRVar13));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_59);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"roughness = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((undefined1 *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 0xc) +
                    (long)pRVar13) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((long)&(((_Rb_tree_header *)
                                        ((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 8))->
                                       _M_header)._M_color + (long)&(pRVar13->prim_name)._M_dataplus
                               ));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                                                0xc) + (long)pRVar13));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_60);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"ior = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((long)&pRVar1[-1].handle +
                    (long)((long)&(pRVar13->prim_name)._M_dataplus._M_p + 4U)) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((long)&(pRVar13->prim_name)._M_dataplus._M_p +
                               (long)&pRVar1[-1].handle));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((long)&pRVar1[-1].handle +
                                               (long)((long)&(pRVar13->prim_name)._M_dataplus._M_p +
                                                     4U)));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_61);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"clearcoat = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((undefined1 *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 0x14) +
                    (long)pRVar13) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((long)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 0x10U) +
                               (long)pRVar13));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                                                0x14) + (long)pRVar13));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_62);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"clearcoatRoughness = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((undefined1 *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 0x1c) +
                    (long)&pRVar13->prim_name) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((long)&(pRVar1->prim_name).field_2 +
                               (long)&pRVar13[-1].material_subsetMap._M_t._M_impl + 8U));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                                                0x1c) + (long)&pRVar13->prim_name));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_63);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"opacity = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((undefined1 *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 4) +
                    (long)&(pRVar13->abs_path)._M_dataplus._M_p) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((long)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 0x20U) +
                               (long)pRVar13));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                                                4) + (long)&(pRVar13->abs_path)._M_dataplus._M_p));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_64);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"opacityThreshold = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((undefined1 *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl + 0xc) +
                    (long)&pRVar13->abs_path) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                               (long)&(pRVar13->abs_path)._M_string_length));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&pRVar1[-1].material_subsetMap._M_t._M_impl +
                                                0xc) + (long)&pRVar13->abs_path));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_65);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"normal = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((undefined1 *)((long)&(pRVar1->prim_name)._M_string_length + 4) + (long)pRVar13
                    ) < 0) {
          ::std::operator<<(local_330,
                            (float3 *)
                            ((long)&(pRVar13->prim_name)._M_dataplus._M_p + (long)&pRVar1->prim_name
                            ));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((undefined1 *)
                                                ((long)&(pRVar1->prim_name)._M_string_length + 4) +
                                               (long)pRVar13));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_66);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"displacement = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((pRVar1->prim_name).field_2._M_local_buf + 4 + (long)pRVar13) < 0) {
          ::std::ostream::operator<<
                    (local_330,*(float *)((long)&(pRVar1->prim_name).field_2 + (long)pRVar13));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((pRVar1->prim_name).field_2._M_local_buf + 4 +
                                               (long)pRVar13));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,n_67);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"occlusion = ");
        ::std::__cxx11::string::_M_dispose();
        if (*(int *)((pRVar1->prim_name).field_2._M_local_buf + 0xc + (long)pRVar13) < 0) {
          ::std::ostream::operator<<
                    (local_330,
                     *(float *)((pRVar1->prim_name).field_2._M_local_buf + 8 + (long)pRVar13));
        }
        else {
          poVar10 = ::std::operator<<(local_330,"texture_id[");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(int *)((pRVar1->prim_name).field_2._M_local_buf + 0xc +
                                               (long)pRVar13));
          ::std::operator<<(poVar10,"]");
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x2,n_68);
        poVar10 = ::std::operator<<(local_330,(string *)&local_4f8);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
        ::std::operator<<(local_4b8,(string *)&local_4f8);
        ::std::__cxx11::string::_M_dispose();
        ::std::operator<<(local_4b8,"\n");
        pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x1,n_69);
        poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_3);
        ::std::operator<<((ostream *)local_560,(string *)&ss_1);
        ::std::__cxx11::string::_M_dispose();
        pAVar17 = (pointer)((long)&(local_568->prim_name)._M_dataplus._M_p + 1);
        pRVar22 = (RenderMesh *)
                  &(pRVar13->triangulatedFaceCounts).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      ::std::operator<<(local_1a8,"}\n");
      ::std::operator<<(local_1a8,"\n");
      ::std::operator<<(local_1a8,"textures {\n");
      pRVar22 = (RenderMesh *)0x0;
      while (pRVar22 < (RenderMesh *)
                       (((long)(pRVar19->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pRVar19->textures).
                              super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x158)) {
        poVar10 = ::std::operator<<(local_1a8,"[");
        poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        local_568 = (pointer)::std::operator<<(poVar10,"] ");
        pUVar4 = (pRVar19->textures).
                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_560 = (pointer)(pUVar4 + (long)pRVar22);
        local_570 = pRVar22;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
        ::std::operator<<(local_330,"UVTexture {\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_70);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"primvar_name ");
        poVar10 = ::std::operator<<(poVar10,(string *)&pUVar4[(long)pRVar22].varname_uv);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_71);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"connectedOutputChannel ");
        ::std::__cxx11::string::_M_dispose();
        (anonymous_namespace)::to_string_abi_cxx11_
                  ((string *)&ss_3,
                   (_anonymous_namespace_ *)(ulong)pUVar4[(long)pRVar22].connectedOutputChannel,
                   channel);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_72);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"authoredOutputChannels ");
        ::std::__cxx11::string::_M_dispose();
        auVar27._8_8_ = extraout_RDX_04;
        auVar27._0_8_ =
             *(_Base_ptr *)((long)&pUVar4[(long)pRVar22].authoredOutputChannels._M_t._M_impl + 0x18)
        ;
        while (p_Var16 = auVar27._0_8_,
              p_Var16 !=
              (_Rb_tree_node_base *)
              ((long)&pUVar4[(long)pRVar22].authoredOutputChannels._M_t._M_impl + 8U)) {
          (anonymous_namespace)::to_string_abi_cxx11_
                    ((string *)&ss_3,(_anonymous_namespace_ *)(ulong)p_Var16[1]._M_color,
                     auVar27._8_4_);
          poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
          ::std::operator<<(poVar10," ");
          ::std::__cxx11::string::_M_dispose();
          auVar27 = ::std::_Rb_tree_increment(p_Var16);
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_73);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"bias ");
        pRVar13 = local_560;
        poVar10 = ::std::operator<<(poVar10,(float4 *)
                                            ((long)&(local_560->usdFaceVertexCounts).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8));
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_74);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"scale ");
        poVar10 = ::std::operator<<(poVar10,(float4 *)&pRVar13->triangulatedFaceVertexIndices);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_75);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"wrapS ");
        to_string_abi_cxx11_
                  (&local_4f8,
                   (tydra *)(ulong)*(WrapMode *)
                                    &(((SkelNode *)&pRVar13->is_single_indexable)->joint_path).
                                     _M_dataplus._M_p,mode);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_76);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"wrapT ");
        to_string_abi_cxx11_(&local_4f8,(tydra *)(ulong)*(WrapMode *)&pRVar13->field_0x64,mode_00);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_77);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"fallback_uv ");
        poVar10 = ::std::operator<<(poVar10,(float4 *)
                                            ((long)&(pRVar13->triangulatedFaceVertexCounts).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 0x10));
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_78);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"textureImageID ");
        ::std::__cxx11::to_string
                  (&local_4f8,
                   (long)*(pointer *)
                          ((long)&(pRVar13->normals).data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          + 8));
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_79);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"has UsdTransform2d ");
        ::std::__cxx11::to_string
                  (&local_4f8,
                   (uint)*(byte *)((long)&(pRVar13->triangulatedToOrigFaceVertexIndexMap).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl + 8));
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (*(char *)((long)&(pRVar13->triangulatedToOrigFaceVertexIndexMap).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl + 8) != '\0') {
          pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_80);
          poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
          poVar10 = ::std::operator<<(poVar10,"rotation ");
          poVar10 = (ostream *)
                    ::std::ostream::operator<<
                              (poVar10,*(float *)&(pRVar13->normals).name._M_dataplus);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_81);
          poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
          poVar10 = ::std::operator<<(poVar10,"scale ");
          poVar10 = ::std::operator<<(poVar10,(vec2 *)((long)&(pRVar13->normals).name._M_dataplus +
                                                      4));
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_82);
          poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
          poVar10 = ::std::operator<<(poVar10,"translation ");
          poVar10 = ::std::operator<<(poVar10,(vec2 *)((long)&(pRVar13->normals).name.
                                                              _M_string_length + 4));
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x3,n_83);
          poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
          poVar10 = ::std::operator<<(poVar10,"computed_transform ");
          poVar10 = ::std::operator<<(poVar10,(matrix3f *)
                                              ((long)&(pRVar13->triangulatedToOrigFaceVertexIndexMap
                                                      ).
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl + 0xc));
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_84);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
        ::std::operator<<((ostream *)local_568,(string *)&ss_3);
        ::std::__cxx11::string::_M_dispose();
        pRVar19 = local_538;
        pRVar22 = (RenderMesh *)((long)&(local_570->prim_name)._M_dataplus._M_p + 1);
      }
      ::std::operator<<(local_1a8,"}\n");
      ::std::operator<<(local_1a8,"\n");
      ::std::operator<<(local_1a8,"images {\n");
      pRVar22 = (RenderMesh *)0x0;
      for (pAVar17 = (pointer)0x0;
          pAVar17 < (pointer)(((long)(pRVar19->images).
                                     super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pRVar19->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x50);
          pAVar17 = (pointer)((long)&(pAVar17->prim_name)._M_dataplus._M_p + 1)) {
        poVar10 = ::std::operator<<(local_1a8,"[");
        poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        local_560 = (pointer)::std::operator<<(poVar10,"] ");
        pTVar5 = (pRVar19->images).
                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_568 = pAVar17;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
        local_570 = pRVar22;
        ::std::operator<<(local_330,"TextureImage {\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_85);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"asset_identifier \"");
        poVar10 = ::std::operator<<(poVar10,(string *)
                                            ((long)&(pRVar22->prim_name)._M_dataplus._M_p +
                                            (long)pTVar5));
        ::std::operator<<(poVar10,"\"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_86);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"channels ");
        ::std::__cxx11::to_string
                  (&local_4f8,
                   *(int *)((long)&(local_570->abs_path).field_2 +
                           (long)&(pTVar5->asset_identifier)._M_string_length));
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_87);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"width ");
        ::std::__cxx11::to_string
                  (&local_4f8,*(int *)((long)&(local_570->abs_path).field_2 + (long)pTVar5));
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_88);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"height ");
        ::std::__cxx11::to_string
                  (&local_4f8,
                   *(int *)((long)&(local_570->abs_path).field_2 +
                           (long)((long)&(pTVar5->asset_identifier)._M_dataplus._M_p + 4U)));
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_89);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"miplevel ");
        ::std::__cxx11::to_string
                  (&local_4f8,
                   *(int *)((long)&(local_570->abs_path).field_2 +
                           (long)((long)&(pTVar5->asset_identifier)._M_string_length + 4)));
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_90);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"colorSpace ");
        to_string_abi_cxx11_
                  (&local_4f8,
                   (tydra *)(ulong)*(uint *)((long)&(local_570->abs_path)._M_string_length +
                                            (long)pTVar5),cty);
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_91);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"bufferID ");
        pAVar17 = local_568;
        ::std::__cxx11::to_string
                  (&local_4f8,
                   *(long *)((long)&(local_570->display_name)._M_dataplus._M_p + (long)pTVar5));
        pRVar19 = local_538;
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_92);
        pRVar13 = local_570;
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
        ::std::operator<<((ostream *)local_560,(string *)&ss_3);
        ::std::__cxx11::string::_M_dispose();
        pRVar22 = (RenderMesh *)&(pRVar13->display_name).field_2;
      }
      ::std::operator<<(local_1a8,"}\n");
      ::std::operator<<(local_1a8,"\n");
      ::std::operator<<(local_1a8,"buffers {\n");
      pRVar22 = (RenderMesh *)0x0;
      while (pRVar22 < (RenderMesh *)
                       ((long)(pRVar19->buffers).
                              super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pRVar19->buffers).
                              super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        poVar10 = ::std::operator<<(local_1a8,"[");
        poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        local_568 = (pointer)::std::operator<<(poVar10,"] ");
        pBVar6 = (pRVar19->buffers).
                 super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_570 = pRVar22;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
        ::std::operator<<(local_330,"Buffer {\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_93);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"bytes ");
        lVar21 = local_4d8;
        poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x2,n_94);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        poVar10 = ::std::operator<<(poVar10,"componentType ");
        pRVar13 = local_570;
        to_string_abi_cxx11_
                  (&local_4f8,(tydra *)(ulong)*(uint *)((long)pBVar6 + lVar21 + -0x10),cty_00);
        pRVar19 = local_538;
        poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::operator<<(local_330,"\n");
        pprint::Indent_abi_cxx11_((string *)&ss_3,(pprint *)0x1,n_95);
        poVar10 = ::std::operator<<(local_330,(string *)&ss_3);
        ::std::operator<<(poVar10,"}\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
        ::std::operator<<((ostream *)local_568,(string *)&ss_3);
        ::std::__cxx11::string::_M_dispose();
        local_4d8 = lVar21 + 0x20;
        pRVar22 = (RenderMesh *)((long)&(pRVar13->prim_name)._M_dataplus._M_p + 1);
      }
      ::std::operator<<(local_1a8,"}\n");
      psVar15 = local_4d0;
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return psVar15;
    }
    poVar10 = ::std::operator<<(local_1a8,"[");
    poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    local_530 = ::std::operator<<(poVar10,"] ");
    local_568 = (pRVar19->animations).
                super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_570 = (pointer)((long)psVar15 * 0xc0);
    pAVar17 = local_568 + (long)psVar15;
    local_520 = psVar15;
    ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_3);
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x1,n_39);
    poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
    ::std::operator<<(poVar10,"animation {\n");
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,n_40);
    poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
    poVar10 = ::std::operator<<(poVar10,"name ");
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,&pAVar17->prim_name,&local_558);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,n_41);
    poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
    local_560 = (pointer)::std::operator<<(poVar10,"abs_path ");
    pAVar17 = local_568;
    psVar15 = &local_568->prim_name;
    psVar7 = &local_570->abs_path;
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,(string *)((long)&(psVar7->_M_dataplus)._M_p + (long)psVar15),&local_558);
    poVar10 = ::std::operator<<((ostream *)local_560,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,n_42);
    poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
    poVar10 = ::std::operator<<(poVar10,"display_name ");
    pRVar13 = local_570;
    psVar15 = &local_570->display_name;
    ::std::__cxx11::string::string((string *)&local_558,"\"",(allocator *)&local_518);
    quote(&local_4f8,(string *)((long)&(psVar15->_M_dataplus)._M_p + (long)&pAVar17->prim_name),
          &local_558);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    auVar26._8_8_ = local_570;
    auVar26._0_8_ =
         *(undefined8 *)
          ((long)&(pRVar13->points).
                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)&(pAVar17->prim_name).field_2);
    local_528 = (pointer)((long)&(local_568->prim_name)._M_dataplus._M_p +
                         (long)&(local_570->points).
                                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    while (pRVar13 = auVar26._0_8_, pRVar13 != local_528) {
      pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,auVar26._8_4_);
      poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
      poVar10 = ::std::operator<<(poVar10,(string *)&pRVar13->abs_path);
      ::std::operator<<(poVar10," {\n");
      ::std::__cxx11::string::_M_dispose();
      auVar25._8_8_ = extraout_RDX_03;
      auVar25._0_8_ = *(undefined8 *)((long)&(pRVar13->display_name).field_2 + 8);
      local_570 = (pointer)&(pRVar13->display_name)._M_string_length;
      local_560 = pRVar13;
      while( true ) {
        pRVar22 = auVar25._0_8_;
        uVar14 = auVar25._8_4_;
        if (pRVar22 == local_570) break;
        iVar2 = *(int *)&(pRVar22->abs_path)._M_dataplus._M_p;
        if (iVar2 == 3) {
          pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x3,uVar14);
          poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
          poVar10 = ::std::operator<<(poVar10,"scales ");
          (anonymous_namespace)::detail::PrintAnimationSamples<std::array<float,3ul>>
                    (&local_558,(detail *)&pRVar22->normals,samples_00);
          ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
          quote(&local_4f8,&local_558,&local_518);
          poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
LAB_002a3606:
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        else if (iVar2 == 2) {
          pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)0x3,uVar14);
          poVar10 = ::std::operator<<(local_4b8,(string *)&local_4f8);
          local_568 = (pointer)::std::operator<<(poVar10,"rotations ");
          ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
          ::std::operator<<(local_330,"[");
          lVar21 = 4;
          for (uVar18 = 0;
              uVar18 < (ulong)(((long)(pRVar22->triangulatedToOrigFaceVertexIndexMap).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pRVar22->triangulatedToOrigFaceVertexIndexMap).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x14);
              uVar18 = uVar18 + 1) {
            if (uVar18 != 0) {
              ::std::operator<<(local_330,", ");
            }
            poVar10 = ::std::operator<<(local_330,"(");
            poVar10 = (ostream *)
                      ::std::ostream::operator<<
                                (poVar10,*(float *)((long)(pRVar22->
                                                          triangulatedToOrigFaceVertexIndexMap).
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar21 + -4));
            poVar10 = ::std::operator<<(poVar10,", ");
            poVar10 = ::std::operator<<(poVar10,(float4 *)
                                                ((long)(pRVar22->
                                                       triangulatedToOrigFaceVertexIndexMap).
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar21
                                                ));
            ::std::operator<<(poVar10,")");
            lVar21 = lVar21 + 0x14;
          }
          ::std::operator<<(local_330,"]");
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
          ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
          quote((string *)&ss_1,&local_558,&local_518);
          poVar10 = ::std::operator<<((ostream *)local_568,(string *)&ss_1);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        else if (iVar2 == 1) {
          pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x3,uVar14);
          poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
          poVar10 = ::std::operator<<(poVar10,"translations ");
          (anonymous_namespace)::detail::PrintAnimationSamples<std::array<float,3ul>>
                    (&local_558,
                     (detail *)
                     &(pRVar22->usdFaceVertexCounts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,samples);
          ::std::__cxx11::string::string((string *)&local_518,"\"",&local_571);
          quote(&local_4f8,&local_558,&local_518);
          poVar10 = ::std::operator<<(poVar10,(string *)&local_4f8);
          ::std::operator<<(poVar10,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          goto LAB_002a3606;
        }
        auVar25 = ::std::_Rb_tree_increment((_Rb_tree_node_base *)pRVar22);
      }
      pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x2,uVar14);
      poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
      ::std::operator<<(poVar10,"}\n");
      ::std::__cxx11::string::_M_dispose();
      auVar26 = ::std::_Rb_tree_increment((_Rb_tree_node_base *)local_560);
    }
    ::std::operator<<(local_4b8,"\n");
    pprint::Indent_abi_cxx11_((string *)&ss_1,(pprint *)0x1,n_43);
    poVar10 = ::std::operator<<(local_4b8,(string *)&ss_1);
    ::std::operator<<(poVar10,"}\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_3);
    ::std::operator<<(local_530,(string *)&ss_1);
    ::std::__cxx11::string::_M_dispose();
    psVar15 = (string *)((long)&(local_520->_M_dataplus)._M_p + 1);
  } while( true );
}

Assistant:

std::string DumpRenderScene(const RenderScene &scene,
                            const std::string &format) {
  std::stringstream ss;

  if (format == "json") {
    // TODO:
    // Currently kdl only.
    ss << "// `json` format is not supported yet. Use KDL format\n";
  }

  ss << "title " << quote(scene.usd_filename) << "\n";
  ss << "default_root_node " << scene.default_root_node << "\n";
  ss << "// # of Root Nodes : " << scene.nodes.size() << "\n";
  ss << "// # of Meshes : " << scene.meshes.size() << "\n";
  ss << "// # of Skeletons : " << scene.skeletons.size() << "\n";
  ss << "// # of Animations : " << scene.animations.size() << "\n";
  ss << "// # of Cameras : " << scene.cameras.size() << "\n";
  ss << "// # of Materials : " << scene.materials.size() << "\n";
  ss << "// # of UVTextures : " << scene.textures.size() << "\n";
  ss << "// # of TextureImages : " << scene.images.size() << "\n";
  ss << "// # of Buffers : " << scene.buffers.size() << "\n";

  ss << "\n";

  ss << "nodes {\n";
  for (size_t i = 0; i < scene.nodes.size(); i++) {
    ss << DumpNode(scene.nodes[i], 1);
  }
  ss << "}\n";

  ss << "meshes {\n";
  for (size_t i = 0; i < scene.meshes.size(); i++) {
    ss << "[" << i << "] " << DumpMesh(scene.meshes[i], 1);
  }
  ss << "}\n";

  ss << "skeletons {\n";
  for (size_t i = 0; i < scene.skeletons.size(); i++) {
    ss << "[" << i << "] " << DumpSkeleton(scene.skeletons[i], 1);
  }
  ss << "}\n";

  ss << "animations {\n";
  for (size_t i = 0; i < scene.animations.size(); i++) {
    ss << "[" << i << "] " << DumpAnimation(scene.animations[i], 1);
  }
  ss << "}\n";

  ss << "cameras {\n";
  for (size_t i = 0; i < scene.cameras.size(); i++) {
    ss << "[" << i << "] " << DumpCamera(scene.cameras[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "materials {\n";
  for (size_t i = 0; i < scene.materials.size(); i++) {
    ss << "[" << i << "] " << DumpMaterial(scene.materials[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "textures {\n";
  for (size_t i = 0; i < scene.textures.size(); i++) {
    ss << "[" << i << "] " << DumpUVTexture(scene.textures[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "images {\n";
  for (size_t i = 0; i < scene.images.size(); i++) {
    ss << "[" << i << "] " << DumpImage(scene.images[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "buffers {\n";
  for (size_t i = 0; i < scene.buffers.size(); i++) {
    ss << "[" << i << "] " << DumpBuffer(scene.buffers[i], 1);
  }
  ss << "}\n";

  // ss << "TODO: AnimationChannel, ...\n";

  return ss.str();
}